

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O2

void generate<trng::mt19937>(size_t samples,unsigned_long seed)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  mt19937 r;
  
  trng::mt19937::mt19937(&r);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"# generator ");
  pcVar2 = trng::mt19937::name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"  seed = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "#==================================================================\n");
  poVar1 = std::operator<<(poVar1,"type: d\n");
  poVar1 = std::operator<<(poVar1,"count: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"numbit: ");
  trng::int_math::log2_ceil<unsigned_int>(0xffffffff);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  while( true ) {
    std::operator<<(poVar1,'\n');
    bVar3 = samples == 0;
    samples = samples - 1;
    if (bVar3) break;
    trng::mt19937::operator()(&r);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}